

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot.cpp
# Opt level: O1

bool duckdb::Transformer::TransformPivotInList
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *expr,PivotColumnEntry *entry,bool root_entry)

{
  ExpressionType EVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar2;
  optional_idx error_location;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer pPVar6;
  BaseExpression *pBVar7;
  ColumnRefExpression *this;
  string *__args;
  FunctionExpression *pFVar8;
  type expr_00;
  ParserException *this_00;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr_01
  ;
  Value val;
  Value local_78;
  LogicalType local_38;
  
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  EVar1 = (pPVar6->super_BaseExpression).type;
  if (EVar1 == FUNCTION) {
    pBVar7 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    pFVar8 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar7);
    iVar5 = ::std::__cxx11::string::compare((char *)&pFVar8->function_name);
    if (iVar5 == 0) {
      expr_01 = (pFVar8->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pFVar8->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = expr_01 == puVar2;
      if ((!bVar3) && (bVar4 = TransformPivotInList(expr_01,entry,false), bVar4)) {
        do {
          expr_01 = expr_01 + 1;
          bVar3 = expr_01 == puVar2;
          if (bVar3) {
            return bVar3;
          }
          bVar4 = TransformPivotInList(expr_01,entry,false);
        } while (bVar4);
      }
    }
    else {
      bVar3 = false;
    }
  }
  else if (EVar1 == COLUMN_REF) {
    pBVar7 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    this = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar7);
    bVar3 = ColumnRefExpression::IsQualified(this);
    if (bVar3) {
      this_00 = (ParserException *)__cxa_allocate_exception(0x10);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(expr);
      error_location.index = (pPVar6->super_BaseExpression).query_location.index;
      local_78.type_._0_8_ = (long)&local_78 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"PIVOT IN list cannot contain qualified column references","");
      ParserException::ParserException<>(this_00,error_location,(string *)&local_78);
      __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    __args = ColumnRefExpression::GetColumnName_abi_cxx11_(this);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)entry,__args);
    bVar3 = true;
  }
  else {
    LogicalType::LogicalType(&local_38,SQLNULL);
    Value::Value(&local_78,&local_38);
    LogicalType::~LogicalType(&local_38);
    expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    bVar3 = ConstructConstantFromExpression(expr_00,&local_78);
    if (bVar3) {
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)entry,&local_78);
    }
    Value::~Value(&local_78);
  }
  return bVar3;
}

Assistant:

bool Transformer::TransformPivotInList(unique_ptr<ParsedExpression> &expr, PivotColumnEntry &entry, bool root_entry) {
	switch (expr->GetExpressionType()) {
	case ExpressionType::COLUMN_REF: {
		auto &colref = expr->Cast<ColumnRefExpression>();
		if (colref.IsQualified()) {
			throw ParserException(expr->GetQueryLocation(), "PIVOT IN list cannot contain qualified column references");
		}
		entry.values.emplace_back(colref.GetColumnName());
		return true;
	}
	case ExpressionType::FUNCTION: {
		auto &function = expr->Cast<FunctionExpression>();
		if (function.function_name != "row") {
			return false;
		}
		for (auto &child : function.children) {
			if (!TransformPivotInList(child, entry, false)) {
				return false;
			}
		}
		return true;
	}
	default: {
		Value val;
		if (!Transformer::ConstructConstantFromExpression(*expr, val)) {
			return false;
		}
		entry.values.push_back(std::move(val));
		return true;
	}
	}
}